

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O3

int comparepoints(void *arg1,void *arg2)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  lVar1 = *arg1;
  lVar2 = *arg2;
  if (deathmatch.Value == 0) {
    iVar4 = *(int *)(lVar2 + 0xf8) - *(int *)(lVar1 + 0xf8);
  }
  else {
    iVar4 = *(int *)(lVar2 + 0xc4) - *(int *)(lVar1 + 0xc4);
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  puVar3 = (undefined8 *)
           ((ulong)((*(int *)(lVar1 + 0x48) - 1U & 0x1cf) * 0x18) + *(long *)(lVar1 + 0x38));
  do {
    puVar5 = puVar3;
    puVar3 = (undefined8 *)*puVar5;
  } while (*(int *)(puVar5 + 1) != 0x1cf);
  puVar3 = (undefined8 *)
           ((ulong)((*(int *)(lVar2 + 0x48) - 1U & 0x1cf) * 0x18) + *(long *)(lVar2 + 0x38));
  do {
    puVar6 = puVar3;
    puVar3 = (undefined8 *)*puVar6;
  } while (*(int *)(puVar6 + 1) != 0x1cf);
  iVar4 = strcasecmp(*(char **)(puVar5[2] + 0x28),*(char **)(puVar6[2] + 0x28));
  return iVar4;
}

Assistant:

int comparepoints (const void *arg1, const void *arg2)
{
	// Compare first be frags/kills, then by name.
	player_t *p1 = *(player_t **)arg1;
	player_t *p2 = *(player_t **)arg2;
	int diff;

	diff = deathmatch ? p2->fragcount - p1->fragcount : p2->killcount - p1->killcount;
	if (diff == 0)
	{
		diff = stricmp(p1->userinfo.GetName(), p2->userinfo.GetName());
	}
	return diff;
}